

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptSamplerType(HlslGrammar *this,TType *type)

{
  TSampler TVar1;
  EHlslTokenClass EVar2;
  uint uVar3;
  TSampler sampler;
  TType local_b8;
  
  EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  uVar3 = EVar2 - EHTokSampler;
  if (uVar3 < 7) {
    TVar1 = *(TSampler *)(&DAT_00605ad4 + (ulong)uVar3 * 4);
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    sampler = TVar1;
    TType::TType(&local_b8,&sampler,EvqUniform,(TArraySizes *)0x0);
    TType::shallowCopy(type,&local_b8);
  }
  return uVar3 < 7;
}

Assistant:

bool HlslGrammar::acceptSamplerType(TType& type)
{
    // read sampler type
    const EHlslTokenClass samplerType = peek();

    // TODO: for DX9
    // TSamplerDim dim = EsdNone;

    bool isShadow = false;

    switch (samplerType) {
    case EHTokSampler:      break;
    case EHTokSampler1d:    /*dim = Esd1D*/; break;
    case EHTokSampler2d:    /*dim = Esd2D*/; break;
    case EHTokSampler3d:    /*dim = Esd3D*/; break;
    case EHTokSamplerCube:  /*dim = EsdCube*/; break;
    case EHTokSamplerState: break;
    case EHTokSamplerComparisonState: isShadow = true; break;
    default:
        return false;  // not a sampler declaration
    }

    advanceToken();  // consume the sampler type keyword

    TArraySizes* arraySizes = nullptr; // TODO: array

    TSampler sampler;
    sampler.setPureSampler(isShadow);

    type.shallowCopy(TType(sampler, EvqUniform, arraySizes));

    return true;
}